

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetMass_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_GetMass_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  char *message;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar;
  ParticleType particle;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
            (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this);
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a520b016873bbd3
  ;
  local_60.data_ =
       *(AssertHelperData **)(pica::ParticleTypes::types + (long)particle.typeIndex * 0x10);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"pica::Constants<MassType>::electronMass()","particle.getMass()",
             (double *)&local_58,(double *)&local_60);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0xab,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetMass)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;

    ParticleType particle = this->randomParticle();
    ASSERT_EQ(pica::Constants<MassType>::electronMass(), particle.getMass());
}